

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint postProcessScanlines(uchar *out,uchar *in,uint w,uint h,LodePNGInfo *info_png)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uchar *out_00;
  uint uVar16;
  size_t bytewidth;
  bool bVar18;
  uint local_254;
  uint passh [7];
  uint passh_1 [7];
  uint passw_1 [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  int iVar17;
  
  uVar11 = (ulong)(info_png->color).colortype;
  iVar17 = 0;
  if (uVar11 < 7) {
    iVar17 = *(int *)(&DAT_00239000 + uVar11 * 4);
  }
  uVar16 = iVar17 * (info_png->color).bitdepth;
  if (uVar16 == 0) {
    return 0x1f;
  }
  if (info_png->interlace_method == 0) {
    if (uVar16 < 8) {
      uVar6 = uVar16 * w;
      uVar5 = uVar6 + 7 & 0xfffffff8;
      if (uVar6 != uVar5) {
        uVar16 = unfilter(in,in,w,h,uVar16);
        if (uVar16 == 0) {
          removePaddingBits(out,in,(ulong)uVar6,(ulong)uVar5,h);
          return 0;
        }
        return uVar16;
      }
    }
    uVar16 = unfilter(out,in,w,h,uVar16);
    if (uVar16 != 0) {
      return uVar16;
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar16);
    out_00 = in + padded_passstart[0];
    uVar5 = unfilter(out_00,in + filter_passstart[0],passw[0],passh[0],uVar16);
    if (uVar5 == 0) {
      local_254 = passh[0];
      lVar10 = 0;
LAB_001af7a2:
      if (uVar16 < 8) {
        removePaddingBits(in + *(long *)((long)passstart + lVar10 * 2),out_00,
                          (ulong)(passw[0] * uVar16),(ulong)(passw[0] * uVar16 + 7 & 0xfffffff8),
                          local_254);
      }
      bVar18 = lVar10 == 0x18;
      if (!bVar18) goto code_r0x001af7e1;
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_1b8,w,h,uVar16
                         );
      if (uVar16 < 8) {
        lVar10 = 0;
        do {
          uVar6 = passh_1[lVar10];
          if (uVar6 != 0) {
            uVar14 = passw_1[lVar10];
            uVar15 = 0;
            do {
              if ((ulong)uVar14 != 0) {
                sVar4 = local_1b8[lVar10];
                uVar9 = ADAM7_DY[lVar10];
                uVar1 = ADAM7_IY[lVar10];
                uVar2 = ADAM7_DX[lVar10];
                uVar3 = ADAM7_IX[lVar10];
                uVar11 = 0;
                do {
                  uVar8 = (ulong)((uVar2 * (int)uVar11 + (uVar9 * uVar15 + uVar1) * w + uVar3) *
                                 uVar16);
                  uVar7 = (ulong)(((int)uVar11 + uVar15 * uVar14) * uVar16) + sVar4 * 8;
                  uVar13 = uVar16;
                  do {
                    if ((in[uVar7 >> 3] >> (~(byte)uVar7 & 7) & 1) != 0) {
                      out[uVar8 >> 3] = out[uVar8 >> 3] | '\x01' << (~(byte)uVar8 & 7);
                    }
                    uVar8 = uVar8 + 1;
                    uVar7 = uVar7 + 1;
                    uVar13 = uVar13 - 1;
                  } while (uVar13 != 0);
                  uVar11 = uVar11 + 1;
                } while (uVar11 != uVar14);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar6);
          }
          lVar10 = lVar10 + 1;
          uVar6 = uVar5;
        } while (lVar10 != 7);
      }
      else {
        uVar11 = (ulong)(uVar16 >> 3);
        lVar10 = 0;
        do {
          uVar16 = passh_1[lVar10];
          if (uVar16 != 0) {
            uVar6 = passw_1[lVar10];
            uVar7 = 0;
            uVar14 = 0;
            do {
              iVar17 = (int)uVar7;
              if ((ulong)uVar6 != 0) {
                uVar15 = ADAM7_DX[lVar10];
                uVar9 = (ADAM7_DY[lVar10] * uVar14 + ADAM7_IY[lVar10]) * w + ADAM7_IX[lVar10];
                sVar4 = local_1b8[lVar10];
                uVar8 = 0;
                do {
                  uVar12 = 0;
                  do {
                    out[uVar12 + uVar9 * uVar11] = in[uVar12 + uVar7 * uVar11 + sVar4];
                    uVar12 = uVar12 + 1;
                  } while (uVar11 != uVar12);
                  uVar8 = uVar8 + 1;
                  uVar9 = uVar9 + uVar15;
                  uVar7 = (ulong)((int)uVar7 + 1);
                } while (uVar8 != uVar6);
              }
              uVar14 = uVar14 + 1;
              uVar7 = (ulong)(iVar17 + uVar6);
            } while (uVar14 != uVar16);
          }
          lVar10 = lVar10 + 1;
          uVar6 = uVar5;
        } while (lVar10 != 7);
      }
      goto LAB_001afa73;
    }
    bVar18 = false;
    uVar6 = uVar5;
LAB_001afa73:
    if (!bVar18) {
      return uVar6;
    }
  }
  return 0;
code_r0x001af7e1:
  out_00 = in + *(long *)((long)padded_passstart + lVar10 * 2 + 8);
  passw[0] = *(uint *)((long)passw + lVar10 + 4);
  local_254 = *(uint *)((long)passh + lVar10 + 4);
  uVar6 = unfilter(out_00,in + *(long *)((long)filter_passstart + lVar10 * 2 + 8),passw[0],local_254
                   ,uVar16);
  lVar10 = lVar10 + 4;
  if (uVar6 != 0) goto LAB_001afa73;
  goto LAB_001af7a2;
}

Assistant:

static unsigned postProcessScanlines(unsigned char* out, unsigned char* in,
                                     unsigned w, unsigned h, const LodePNGInfo* info_png)
{
  /*
  This function converts the filtered-padded-interlaced data into pure 2D image buffer with the PNG's colortype.
  Steps:
  *) if no Adam7: 1) unfilter 2) remove padding bits (= posible extra bits per scanline if bpp < 8)
  *) if adam7: 1) 7x unfilter 2) 7x remove padding bits 3) Adam7_deinterlace
  NOTE: the in buffer will be overwritten with intermediate data!
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  if(bpp == 0) return 31; /*error: invalid colortype*/

  if(info_png->interlace_method == 0)
  {
    if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
    {
      CERROR_TRY_RETURN(unfilter(in, in, w, h, bpp));
      removePaddingBits(out, in, w * bpp, ((w * bpp + 7) / 8) * 8, h);
    }
    /*we can immediatly filter into the out buffer, no other steps needed*/
    else CERROR_TRY_RETURN(unfilter(out, in, w, h, bpp));
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7]; size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned i;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    for(i = 0; i != 7; ++i)
    {
      CERROR_TRY_RETURN(unfilter(&in[padded_passstart[i]], &in[filter_passstart[i]], passw[i], passh[i], bpp));
      /*TODO: possible efficiency improvement: if in this reduced image the bits fit nicely in 1 scanline,
      move bytes instead of bits or move not at all*/
      if(bpp < 8)
      {
        /*remove padding bits in scanlines; after this there still may be padding
        bits between the different reduced images: each reduced image still starts nicely at a byte*/
        removePaddingBits(&in[passstart[i]], &in[padded_passstart[i]], passw[i] * bpp,
                          ((passw[i] * bpp + 7) / 8) * 8, passh[i]);
      }
    }

    Adam7_deinterlace(out, in, w, h, bpp);
  }

  return 0;
}